

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sy_w16_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint in_ESI;
  void *in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  undefined8 uVar3;
  undefined8 uVar5;
  undefined1 auVar4 [16];
  __m128i alVar6;
  void *in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_rb_b;
  __m128i v_ra_b;
  __m128i v_maxval_b;
  __m128i _r;
  undefined8 local_148;
  undefined8 uStackY_140;
  __m128i *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint8_t *puVar7;
  void *local_a8;
  __m128i *local_98;
  __m128i *palStack_90;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar1 = vpinsrw_avx(auVar1,0x200,2);
  auVar1 = vpinsrw_avx(auVar1,0x200,3);
  auVar1 = vpinsrw_avx(auVar1,0x200,4);
  auVar1 = vpinsrw_avx(auVar1,0x200,5);
  auVar1 = vpinsrw_avx(auVar1,0x200,6);
  auVar1 = vpinsrw_avx(auVar1,0x200,7);
  local_98 = auVar1._0_8_;
  palStack_90 = auVar1._8_8_;
  auVar1 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar1 = vpinsrb_avx(auVar1,0x40,2);
  auVar1 = vpinsrb_avx(auVar1,0x40,3);
  auVar1 = vpinsrb_avx(auVar1,0x40,4);
  auVar1 = vpinsrb_avx(auVar1,0x40,5);
  auVar1 = vpinsrb_avx(auVar1,0x40,6);
  auVar1 = vpinsrb_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(auVar1,0x40,8);
  auVar1 = vpinsrb_avx(auVar1,0x40,9);
  auVar1 = vpinsrb_avx(auVar1,0x40,10);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xf);
  local_48 = auVar1._0_8_;
  uStack_40 = auVar1._8_8_;
  local_a8 = in_RDI;
  do {
    xx_loadu_128(in_stack_00000008);
    uVar3 = local_48;
    uVar5 = uStack_40;
    xx_loadu_128((void *)((long)in_stack_00000008 + (ulong)(uint)v_res_b[0]));
    auVar2._8_8_ = uStack_40;
    auVar2._0_8_ = local_48;
    auVar4._8_8_ = uVar5;
    auVar4._0_8_ = uVar3;
    auVar4 = vpavgb_avx(auVar2,auVar4);
    auVar4 = vpsubw_avx(auVar1,auVar4);
    puVar7 = in_R8;
    alVar6 = blend_16_u8(in_R8,(uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28,palStack_90,local_98);
    local_148 = auVar4._0_8_;
    uStackY_140 = auVar4._8_8_;
    alVar6[0] = (longlong)in_R8;
    local_48 = local_148;
    uStack_40 = uStackY_140;
    xx_storeu_128(local_a8,alVar6);
    local_a8 = (void *)((long)local_a8 + (ulong)in_ESI);
    in_R8 = puVar7 + in_R9D;
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)((uint)v_res_b[0] << 1));
    v_res_b[1]._0_4_ = (int)v_res_b[1] + -1;
  } while ((int)v_res_b[1] != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_sy_w16_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h) {
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  do {
    const __m128i v_ra_b = xx_loadu_128(mask);
    const __m128i v_rb_b = xx_loadu_128(mask + mask_stride);
    const __m128i v_m0_b = _mm_avg_epu8(v_ra_b, v_rb_b);

    const __m128i v_m1_b = _mm_sub_epi16(v_maxval_b, v_m0_b);
    const __m128i v_res_b = blend_16_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storeu_128(dst, v_res_b);
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}